

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O0

void litroom(boolean on,obj *obj)

{
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  void *local_68;
  void *local_50;
  int local_34;
  int local_30;
  int ry;
  int rx;
  int rnum;
  obj *otmp;
  obj *poStack_18;
  char is_lit;
  obj *obj_local;
  boolean on_local;
  
  poStack_18 = obj;
  obj_local._7_1_ = on;
  if (on == '\0') {
    if (((u.uprops[0x1e].intrinsic == 0) &&
        (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
         (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
      if ((u._1052_1_ & 1) != 0) {
        pline("It seems even darker in here than before.");
        return;
      }
      if (((uwep == (obj *)0x0) || (bVar1 = artifact_light(uwep), bVar1 == '\0')) ||
         ((*(uint *)&uwep->field_0x4a >> 0x13 & 1) == 0)) {
        pline("You are surrounded by darkness!");
      }
      else {
        pcVar3 = xname(uwep);
        pcVar3 = the(pcVar3);
        pline("Suddenly, the only light left comes from %s!",pcVar3);
      }
    }
    for (_rx = invent; _rx != (obj *)0x0; _rx = _rx->nobj) {
      if ((*(uint *)&_rx->field_0x4a >> 0x13 & 1) != 0) {
        snuff_lit(_rx);
      }
    }
  }
  else if (((u.uprops[0x1e].intrinsic == 0) &&
           (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
          ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
    if ((u._1052_1_ & 1) != 0) {
      if (((u.ustuck)->data->mflags1 & 0x40000) != 0) {
        pcVar3 = Monnam(u.ustuck);
        pcVar3 = s_suffix(pcVar3);
        pcVar4 = mbodypart(u.ustuck,0x12);
        pline("%s %s is lit.",pcVar3,pcVar4);
        return;
      }
      if (((u.ustuck)->data->mlet != '\x16') && ((u.ustuck)->data != mons + 0x9f)) {
        pcVar3 = Monnam(u.ustuck);
        pline("%s glistens.",pcVar3);
        return;
      }
      pcVar3 = Monnam(u.ustuck);
      pline("%s shines briefly.",pcVar3);
      return;
    }
    pline("A lit field surrounds you!");
  }
  if ((((byte)u._1052_1_ >> 1 & 1) == 0) &&
     (bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar1 == '\0')) {
    if (((uball != (obj *)0x0) && (obj_local._7_1_ == '\0')) &&
       (((u.uprops[0x1e].intrinsic == 0 &&
         (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
          (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
        ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))))) {
      move_bc(1,0,uball->ox,uball->oy,uchain->ox,uchain->oy);
    }
    bVar1 = on_level(&u.uz,&dungeon_topology.d_rogue_level);
    if (bVar1 == '\0') {
      bVar5 = false;
      if ((poStack_18 != (obj *)0x0) && (bVar5 = false, poStack_18->oclass == '\t')) {
        bVar5 = (*(uint *)&poStack_18->field_0x4a >> 1 & 1) != 0;
      }
      iVar2 = 5;
      if (bVar5) {
        iVar2 = 9;
      }
      if (obj_local._7_1_ == '\0') {
        local_68 = (void *)0x0;
      }
      else {
        local_68 = (void *)((long)&otmp + 7);
      }
      do_clear_area((int)u.ux,(int)u.uy,iVar2,set_lit,local_68);
    }
    else {
      iVar2 = (*(uint *)&level->locations[u.ux][u.uy].field_0x6 >> 0x10 & 0x3f) - 3;
      if (-1 < iVar2) {
        for (local_30 = level->rooms[iVar2].lx + -1; local_30 <= level->rooms[iVar2].hx + 1;
            local_30 = local_30 + 1) {
          for (local_34 = level->rooms[iVar2].ly + -1; local_34 <= level->rooms[iVar2].hy + 1;
              local_34 = local_34 + 1) {
            if (obj_local._7_1_ == '\0') {
              local_50 = (void *)0x0;
            }
            else {
              local_50 = (void *)((long)&otmp + 7);
            }
            set_lit(local_30,local_34,local_50);
          }
        }
        level->rooms[iVar2].rlit = obj_local._7_1_;
      }
    }
    if (((((u.uprops[0x1e].intrinsic == 0) &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
        (vision_recalc(2), uball != (obj *)0x0)) && (obj_local._7_1_ == '\0')) {
      move_bc(0,0,uball->ox,uball->oy,uchain->ox,uchain->oy);
    }
    vision_full_recalc = '\x01';
  }
  return;
}

Assistant:

void litroom(boolean on, struct obj *obj)
{
	char is_lit;	/* value is irrelevant; we use its address
			   as a `not null' flag for set_lit() */

	/* first produce the text (provided you're not blind) */
	if (!on) {
		struct obj *otmp;

		if (!Blind) {
		    if (u.uswallow) {
			pline("It seems even darker in here than before.");
			return;
		    }
		    if (uwep && artifact_light(uwep) && uwep->lamplit)
			pline("Suddenly, the only light left comes from %s!",
				the(xname(uwep)));
		    else
			pline("You are surrounded by darkness!");
		}

		/* the magic douses lamps, et al, too */
		for (otmp = invent; otmp; otmp = otmp->nobj)
		    if (otmp->lamplit)
			snuff_lit(otmp);
		if (Blind) goto do_it;
	} else {
		if (Blind) goto do_it;
		if (u.uswallow){
			if (is_animal(u.ustuck->data))
				pline("%s %s is lit.",
				        s_suffix(Monnam(u.ustuck)),
					mbodypart(u.ustuck, STOMACH));
			else
				if (is_whirly(u.ustuck->data))
					pline("%s shines briefly.",
					      Monnam(u.ustuck));
				else
					pline("%s glistens.", Monnam(u.ustuck));
			return;
		}
		pline("A lit field surrounds you!");
	}

do_it:
	/* No-op in water - can only see the adjacent squares and that's it! */
	if (Underwater || Is_waterlevel(&u.uz)) return;
	/*
	 *  If we are darkening the room and the hero is punished but not
	 *  blind, then we have to pick up and replace the ball and chain so
	 *  that we don't remember them if they are out of sight.
	 */
	if (Punished && !on && !Blind)
	    move_bc(1, 0, uball->ox, uball->oy, uchain->ox, uchain->oy);

	if (Is_rogue_level(&u.uz)) {
	    /* Can't use do_clear_area because MAX_RADIUS is too small */
	    /* rogue lighting must light the entire room */
	    int rnum = level->locations[u.ux][u.uy].roomno - ROOMOFFSET;
	    int rx, ry;
	    if (rnum >= 0) {
		for (rx = level->rooms[rnum].lx-1; rx <= level->rooms[rnum].hx+1; rx++)
		    for (ry = level->rooms[rnum].ly-1; ry <= level->rooms[rnum].hy+1; ry++)
			set_lit(rx, ry,
				(on ? &is_lit : NULL));
		level->rooms[rnum].rlit = on;
	    }
	    /* hallways remain dark on the rogue level */
	} else
	    do_clear_area(u.ux,u.uy,
		(obj && obj->oclass==SCROLL_CLASS && obj->blessed) ? 9 : 5,
		set_lit, (on ? &is_lit : NULL));

	/*
	 *  If we are not blind, then force a redraw on all positions in sight
	 *  by temporarily blinding the hero.  The vision recalculation will
	 *  correctly update all previously seen positions *and* correctly
	 *  set the waslit bit [could be messed up from above].
	 */
	if (!Blind) {
	    vision_recalc(2);

	    /* replace ball&chain */
	    if (Punished && !on)
		move_bc(0, 0, uball->ox, uball->oy, uchain->ox, uchain->oy);
	}

	vision_full_recalc = 1;	/* delayed vision recalculation */
}